

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

void helper_lswx_ppc64(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t reg,uint32_t ra,
                      uint32_t rb)

{
  uint32_t extraout_EAX;
  ulong uVar1;
  uint uVar2;
  uint extraout_EDX;
  int iVar3;
  ulong uVar4;
  uintptr_t unaff_retaddr;
  
  uVar1 = (ulong)ra;
  uVar2 = (uint)env->xer;
  uVar4 = env->xer & 0x7f;
  if (uVar4 == 0) {
    return;
  }
  iVar3 = ((int)uVar4 + 3U >> 2) + reg;
  if (ra == 0) {
LAB_00b575f8:
    uVar1 = (ulong)(iVar3 < 0x21);
    if ((((int)rb < (int)reg) || (0x20 < iVar3)) || (iVar3 <= (int)rb)) {
LAB_00b57613:
      if ((int)reg <= (int)rb) goto LAB_00b5762a;
      if ((char)uVar1 != '\0') goto LAB_00b5762a;
      if (iVar3 + -0x20 <= (int)rb) goto LAB_00b5762e;
    }
  }
  else if ((((int)ra < (int)reg) || (0x20 < iVar3)) || (iVar3 <= (int)ra)) {
    if (((int)ra < (int)reg) && (0x20 < iVar3)) {
      if (iVar3 + -0x20 <= (int)ra) {
        uVar1 = 0;
        goto LAB_00b57613;
      }
    }
    else if (iVar3 < 0x21) goto LAB_00b575f8;
  }
  do {
    helper_lswx_ppc64_cold_1();
    uVar2 = extraout_EDX;
    reg = extraout_EAX;
LAB_00b5762a:
  } while ((char)uVar1 == '\0');
LAB_00b5762e:
  do_lsw(env,addr,uVar2 & 0x7f,reg,unaff_retaddr);
  return;
}

Assistant:

void helper_lswx(CPUPPCState *env, target_ulong addr, uint32_t reg,
                 uint32_t ra, uint32_t rb)
{
    if (likely(xer_bc != 0)) {
        int num_used_regs = DIV_ROUND_UP(xer_bc, 4);
        if (unlikely((ra != 0 && lsw_reg_in_range(reg, num_used_regs, ra)) ||
                     lsw_reg_in_range(reg, num_used_regs, rb))) {
            raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                                   POWERPC_EXCP_INVAL |
                                   POWERPC_EXCP_INVAL_LSWX, GETPC());
        } else {
            do_lsw(env, addr, xer_bc, reg, GETPC());
        }
    }
}